

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

string * vkt::tessellation::anon_unknown_2::generateGeometryShader
                   (string *__return_storage_ptr__,TessPrimitiveType primitiveType,
                   string *colorSourceName)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_geometry_shader : require\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    pcVar1 = *(char **)(&DAT_00c09440 + (ulong)primitiveType * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    pcVar1 = *(char **)(&DAT_00c09458 + (ulong)primitiveType * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", max_vertices=");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(uint)(primitiveType == TESSPRIMITIVETYPE_ISOLINES) * 3 + 8);
  poVar2 = std::operator<<(poVar2,") out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec4 ");
  poVar2 = std::operator<<(poVar2,(string *)colorSourceName);
  poVar2 = std::operator<<(poVar2,"[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 v_fragment_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    poVar2 = std::operator<<((ostream *)&src,
                             "\tvec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n"
                            );
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tfor (int ndx = 0; ndx < 4; ++ndx)\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\tgl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\tv_fragment_color = ");
    poVar2 = std::operator<<(poVar2,(string *)colorSourceName);
    pcVar1 = "[ndx % 3];\n";
    poVar2 = std::operator<<(poVar2,"[ndx % 3];\n");
    poVar2 = std::operator<<(poVar2,"\t\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\tgl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\tv_fragment_color = ");
    poVar2 = std::operator<<(poVar2,(string *)colorSourceName);
  }
  else {
    if (primitiveType != TESSPRIMITIVETYPE_ISOLINES) goto LAB_00738b5e;
    poVar2 = std::operator<<((ostream *)&src,
                             "\tvec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n"
                            );
    poVar2 = std::operator<<(poVar2,"\tfor (int i = 0; i <= 10; ++i)\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\tfloat xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\tfloat mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n"
                            );
    poVar2 = std::operator<<(poVar2,
                             "\t\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\tv_fragment_color = mix(");
    poVar2 = std::operator<<(poVar2,(string *)colorSourceName);
    poVar2 = std::operator<<(poVar2,"[0], ");
    poVar2 = std::operator<<(poVar2,(string *)colorSourceName);
    pcVar1 = "[1], xweight);\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"\t\tEmitVertex();\n");
  std::operator<<(poVar2,"\t}\n");
LAB_00738b5e:
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return __return_storage_ptr__;
}

Assistant:

std::string generateGeometryShader (const TessPrimitiveType primitiveType, const std::string& colorSourceName)
{
	const int numEmitVertices = (primitiveType == TESSPRIMITIVETYPE_ISOLINES ? 11 : 8);

	std::ostringstream src;
	src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
		<< "#extension GL_EXT_geometry_shader : require\n"
		<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(primitiveType, false) << ") in;\n"
		<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType, false)
					  << ", max_vertices=" << numEmitVertices << ") out;\n"
		<< "\n"
		<< "layout(location = 0) in  highp vec4 " << colorSourceName << "[];\n"
		<< "layout(location = 0) out highp vec4 v_fragment_color;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n";

	if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		src << "	vec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n"
			<< "\n"
			<< "	for (int ndx = 0; ndx < 4; ++ndx)\n"
			<< "	{\n"
			<< "		gl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n"
			<< "		v_fragment_color = " << colorSourceName << "[ndx % 3];\n"
			<< "		EmitVertex();\n"
			<< "\n"
			<< "		gl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n"
			<< "		v_fragment_color = " << colorSourceName << "[ndx % 3];\n"
			<< "		EmitVertex();\n"
			<< "	}\n";
	}
	else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
	{
		src << "	vec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n"
			<< "	for (int i = 0; i <= 10; ++i)\n"
			<< "	{\n"
			<< "		float xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n"
			<< "		float mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n"
			<< "		gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n"
			<< "		v_fragment_color = mix(" << colorSourceName << "[0], " << colorSourceName << "[1], xweight);\n"
			<< "		EmitVertex();\n"
			<< "	}\n";
	}
	else
		DE_ASSERT(false);

	src << "}\n";

	return src.str();
}